

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt8x16Operation::OpShiftLeftByScalar(SIMDValue *value,int count)

{
  uint32 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _x86_SIMDValue _Var4;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar5;
  ulong uStack_f8;
  X86SIMDValue x86tmp1;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  int count_local;
  SIMDValue *value_local;
  ulong local_a8;
  ulong local_88;
  ulong uStack_80;
  
  _Var4 = _x86_SIMDValue::ToX86SIMDValue(value);
  uVar1 = SIMDUtils::SIMDGetShiftAmountMask(1);
  x86tmp1.field_0.i64[1] = _Var4.field_0._0_8_;
  tmpaValue.field_0.i64[0] = _Var4.field_0._8_8_;
  local_88 = X86_HIGHBYTES_MASK.field_0._0_8_;
  uStack_80 = X86_HIGHBYTES_MASK.field_0._8_8_;
  auVar2._8_8_ = tmpaValue.field_0.i64[0] & uStack_80;
  auVar2._0_8_ = x86tmp1.field_0.i64[1] & local_88;
  auVar2 = psllw(auVar2,ZEXT416(count & uVar1));
  auVar3 = psllw((undefined1  [16])_Var4.field_0,ZEXT416(count & uVar1));
  x86tmp1.field_0.i64[1] = auVar3._0_8_;
  local_a8 = X86_LOWBYTES_MASK.field_0._0_8_;
  uStack_f8 = auVar2._0_8_;
  tmpaValue.field_0.i64[1] = x86tmp1.field_0.i64[1] & local_a8 | uStack_f8;
  aVar5 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar5;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpShiftLeftByScalar(const SIMDValue& value, int count)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(value);
        X86SIMDValue x86tmp1;

        count = count & SIMDUtils::SIMDGetShiftAmountMask(1);

        x86tmp1.m128i_value = _mm_and_si128(tmpaValue.m128i_value, X86_HIGHBYTES_MASK.m128i_value);
        x86tmp1.m128i_value = _mm_slli_epi16(x86tmp1.m128i_value, count);

        tmpaValue.m128i_value = _mm_slli_epi16(tmpaValue.m128i_value, count);
        tmpaValue.m128i_value = _mm_and_si128(tmpaValue.m128i_value, X86_LOWBYTES_MASK.m128i_value);

        x86Result.m128i_value = _mm_or_si128(tmpaValue.m128i_value, x86tmp1.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }